

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

void __thiscall icu_63::UnicodeString::swap(UnicodeString *this,UnicodeString *other)

{
  UnicodeString temp;
  UnicodeString local_60;
  
  local_60.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268;
  local_60.fUnion.fStackFields.fLengthAndFlags = 2;
  copyFieldsFrom(&local_60,this,'\0');
  copyFieldsFrom(this,other,'\0');
  copyFieldsFrom(other,&local_60,'\0');
  local_60.fUnion.fStackFields.fLengthAndFlags = 2;
  ~UnicodeString(&local_60);
  return;
}

Assistant:

void UnicodeString::swap(UnicodeString &other) U_NOEXCEPT {
  UnicodeString temp;  // Empty short string: Known not to need releaseArray().
  // Copy fields without resetting source values in between.
  temp.copyFieldsFrom(*this, FALSE);
  this->copyFieldsFrom(other, FALSE);
  other.copyFieldsFrom(temp, FALSE);
  // Set temp to an empty string so that other's memory is not released twice.
  temp.fUnion.fFields.fLengthAndFlags = kShortString;
}